

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

BOOL MAPGetRegionInfo(LPVOID lpAddress,PMEMORY_BASIC_INFORMATION lpBuffer)

{
  int iVar1;
  bool bVar2;
  DWORD DVar3;
  CPalThread *pThread;
  LPVOID pvVar4;
  BOOL BVar5;
  PMAPPED_VIEW_LIST pView;
  LIST_ENTRY *pLVar6;
  
  pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pThread == (CPalThread *)0x0) {
    pThread = CreateCurrentThreadData();
  }
  CorUnix::InternalEnterCriticalSection(pThread,&mapping_critsec);
  pLVar6 = &MappedViewList;
  BVar5 = 0;
  do {
    pLVar6 = pLVar6->Flink;
    if (pLVar6 == &MappedViewList) break;
    bVar2 = true;
    if (pLVar6[1].Blink <= lpAddress) {
      pvVar4 = (LPVOID)((long)&(pLVar6[1].Blink)->Flink +
                       (ulong)(*(int *)&pLVar6[2].Flink + 0xfffU & 0xfffff000));
      bVar2 = pvVar4 <= lpAddress;
      if (lpAddress < pvVar4) {
        BVar5 = 1;
      }
      if (lpBuffer != (PMEMORY_BASIC_INFORMATION)0x0 && lpAddress < pvVar4) {
        lpBuffer->BaseAddress = lpAddress;
        lpBuffer->AllocationProtect = 0;
        lpBuffer->RegionSize = (long)pvVar4 - ((ulong)lpAddress & 0xfffffffffffff000);
        lpBuffer->State = 0x1000;
        iVar1 = *(int *)&pLVar6[2].Blink;
        DVar3 = 4;
        if ((iVar1 != 6) && (DVar3 = 8, 1 < iVar1 - 1U)) {
          if (iVar1 == 4) {
            DVar3 = 2;
          }
          else if (iVar1 == 0) {
            DVar3 = 1;
          }
          else {
            fprintf(_stderr,"] %s %s:%d","MAPConvertAccessToProtect",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
                    ,0x6a6);
            fprintf(_stderr,"Unknown flag for flAccess.\n");
            DVar3 = 0xffffffff;
          }
        }
        lpBuffer->Protect = DVar3;
        lpBuffer->Type = 0x40000;
        BVar5 = 1;
        bVar2 = false;
      }
    }
  } while (bVar2);
  CorUnix::InternalLeaveCriticalSection(pThread,&mapping_critsec);
  return BVar5;
}

Assistant:

BOOL MAPGetRegionInfo(LPVOID lpAddress,
                      PMEMORY_BASIC_INFORMATION lpBuffer)
{
    BOOL fFound = FALSE;
    CPalThread * pThread = InternalGetCurrentThread();
    
    InternalEnterCriticalSection(pThread, &mapping_critsec);

    for(LIST_ENTRY *pLink = MappedViewList.Flink;
        pLink != &MappedViewList;
        pLink = pLink->Flink)
    {
        UINT MappedSize;
        VOID * real_map_addr;
        SIZE_T real_map_sz;
        PMAPPED_VIEW_LIST pView = CONTAINING_RECORD(pLink, MAPPED_VIEW_LIST, Link);

#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
        real_map_addr = pView->pNMHolder->address;
        real_map_sz = pView->pNMHolder->size;
#else
        real_map_addr = pView->lpAddress;
        real_map_sz = pView->NumberOfBytesToMap;
#endif

        MappedSize = ((real_map_sz-1) & ~VIRTUAL_PAGE_MASK) + VIRTUAL_PAGE_SIZE; 
        if ( real_map_addr <= lpAddress && 
             (VOID *)((UINT_PTR)real_map_addr+MappedSize) > lpAddress )
        {
            if (lpBuffer)
            {
                SIZE_T regionSize = MappedSize + (UINT_PTR) real_map_addr - 
                       ((UINT_PTR) lpAddress & ~VIRTUAL_PAGE_MASK);

                lpBuffer->BaseAddress = lpAddress;
                lpBuffer->AllocationProtect = 0;
                lpBuffer->RegionSize = regionSize;
                lpBuffer->State = MEM_COMMIT;
                lpBuffer->Protect = MAPConvertAccessToProtect(pView->dwDesiredAccess);
                lpBuffer->Type = MEM_MAPPED;
            }

            fFound = TRUE;
            break;
        }
    }

    InternalLeaveCriticalSection(pThread, &mapping_critsec);
    
    return fFound;
}